

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_text.cpp
# Opt level: O3

void set_initial_text_values(Am_Object *inter,Am_Object *cmd,Am_Object *obj,int x,int y)

{
  bool bVar1;
  Am_Value *in_value;
  ostream *poVar2;
  Am_Value value;
  Am_Value local_40;
  Am_Object local_30;
  
  local_40.type = 0;
  local_40.value.wrapper_value = (Am_Wrapper *)0x0;
  bVar1 = Am_Object::operator!=(obj,inter);
  if (bVar1) {
    in_value = Am_Object::Get(obj,0xab,1);
    Am_Value::operator=(&local_40,in_value);
    bVar1 = Am_Value::Valid(&local_40);
    if (!bVar1 || local_40.type != 0x8008) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"** Amulet_Error: ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"For text interactor ",0x14);
      poVar2 = operator<<((ostream *)&std::cerr,inter);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2," the Am_TEXT slot of its object ",0x20);
      poVar2 = operator<<(poVar2,obj);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2," must contain a value of type string, but it contains ",0x36);
      poVar2 = operator<<(poVar2,&local_40);
      std::endl<char,std::char_traits<char>>(poVar2);
      Am_Error();
    }
    Am_Object::Am_Object(&local_30,obj);
    move_text_cursor(&local_30,x,y);
    Am_Object::~Am_Object(&local_30);
  }
  Am_Object::Set(inter,0x16c,&local_40,1);
  Am_Object::Set(cmd,0x16c,&local_40,0);
  Am_Value::~Am_Value(&local_40);
  return;
}

Assistant:

void
set_initial_text_values(Am_Object &inter, Am_Object &cmd, Am_Object &obj, int x,
                        int y)
{
  Am_Value value;
  if (obj != inter) { //then is a text create command
    value = obj.Peek(Am_TEXT);
    if (!value.Valid() || value.type != Am_STRING) {
      Am_ERRORO("For text interactor "
                    << inter << " the Am_TEXT slot of its object " << obj
                    << " must contain a value of type string, but it contains "
                    << value,
                obj, Am_TEXT);
    }
    move_text_cursor(obj, x, y);
  }
  inter.Set(Am_OLD_VALUE, value, Am_OK_IF_NOT_THERE);
  cmd.Set(Am_OLD_VALUE, value);
}